

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

fsg_model_t * fsg_model_readfile(char *file,logmath_t *lmath,float32 lw)

{
  FILE *__stream;
  fsg_model_t *pfVar1;
  
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                   ,0x2db,"Failed to open FSG file \'%s\' for reading",file);
    pfVar1 = (fsg_model_t *)0x0;
  }
  else {
    pfVar1 = fsg_model_read((FILE *)__stream,lmath,lw);
    fclose(__stream);
  }
  return pfVar1;
}

Assistant:

fsg_model_t *
fsg_model_readfile(const char *file, logmath_t * lmath, float32 lw)
{
    FILE *fp;
    fsg_model_t *fsg;

    if ((fp = fopen(file, "r")) == NULL) {
        E_ERROR_SYSTEM("Failed to open FSG file '%s' for reading", file);
        return NULL;
    }
    fsg = fsg_model_read(fp, lmath, lw);
    fclose(fp);
    return fsg;
}